

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiShrinkWidthItem *pIVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  ImGuiID IVar17;
  ImGuiTabItemFlags IVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  bool bVar21;
  bool bVar22;
  ImGuiID IVar23;
  int iVar24;
  ImGuiTabItem *pIVar25;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  int iVar26;
  long lVar27;
  ulong uVar28;
  float *pfVar29;
  char *pcVar30;
  ulong uVar31;
  ulong uVar32;
  ImGuiTabItem *pIVar33;
  ImGuiID *pIVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  ImGuiID *pIVar39;
  ImVec2 IVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ImVec2 size;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  ImGuiTabItem item_tmp;
  ImGuiID local_d4;
  ImVec4 local_88;
  undefined8 local_70;
  ImVec4 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar20 = GImGui;
  tab_bar->WantLayout = false;
  uVar37 = (tab_bar->Tabs).Size;
  if ((int)uVar37 < 1) {
    uVar38 = 0;
  }
  else {
    lVar27 = 0;
    uVar31 = 0;
    uVar38 = 0;
    do {
      pIVar33 = (tab_bar->Tabs).Data;
      pIVar34 = (ImGuiID *)((long)&pIVar33->ID + lVar27);
      if (*(int *)((long)&pIVar33->LastFrameVisible + lVar27) < tab_bar->PrevFrameVisible) {
        if (*pIVar34 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        if (uVar31 != uVar38) {
          if ((int)uVar37 <= (int)uVar38) goto LAB_0015bc91;
          IVar23 = pIVar34[0];
          IVar15 = pIVar34[1];
          IVar16 = pIVar34[2];
          IVar17 = pIVar34[3];
          fVar43 = (float)pIVar34[5];
          fVar41 = (float)pIVar34[6];
          fVar42 = (float)pIVar34[7];
          piVar1 = &pIVar33[(int)uVar38].NameOffset;
          *piVar1 = pIVar34[4];
          piVar1[1] = (int)fVar43;
          piVar1[2] = (int)fVar41;
          piVar1[3] = (int)fVar42;
          pIVar33 = pIVar33 + (int)uVar38;
          pIVar33->ID = IVar23;
          pIVar33->Flags = IVar15;
          pIVar33->LastFrameVisible = IVar16;
          pIVar33->LastFrameSelected = IVar17;
          uVar37 = (tab_bar->Tabs).Size;
        }
        uVar38 = uVar38 + 1;
      }
      uVar31 = uVar31 + 1;
      lVar27 = lVar27 + 0x20;
    } while ((long)uVar31 < (long)(int)uVar37);
  }
  if (uVar37 != uVar38) {
    iVar35 = (tab_bar->Tabs).Capacity;
    if (iVar35 < (int)uVar38) {
      if (iVar35 == 0) {
        uVar37 = 8;
      }
      else {
        uVar37 = iVar35 / 2 + iVar35;
      }
      if ((int)uVar37 <= (int)uVar38) {
        uVar37 = uVar38;
      }
      pIVar25 = (ImGuiTabItem *)MemAlloc((long)(int)uVar37 << 5);
      pIVar33 = (tab_bar->Tabs).Data;
      if (pIVar33 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar25,pIVar33,(long)(tab_bar->Tabs).Size << 5);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar25;
      (tab_bar->Tabs).Capacity = uVar37;
    }
    (tab_bar->Tabs).Size = uVar38;
  }
  local_d4 = tab_bar->NextSelectedTabId;
  if (local_d4 != 0) {
    tab_bar->SelectedTabId = local_d4;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    if (0 < (int)uVar38) {
      pIVar33 = (tab_bar->Tabs).Data;
      uVar31 = (ulong)uVar38;
      do {
        if (pIVar33->ID == tab_bar->ReorderRequestTabId) {
          iVar35 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
          uVar37 = tab_bar->ReorderRequestDir + iVar35;
          if ((-1 < (int)uVar37) && ((int)uVar37 < (tab_bar->Tabs).Size)) {
            pIVar5 = (tab_bar->Tabs).Data;
            local_68.x = (float)pIVar33->ID;
            local_68.y = (float)pIVar33->Flags;
            local_68.z = (float)pIVar33->LastFrameVisible;
            local_68.w = (float)pIVar33->LastFrameSelected;
            local_58._0_4_ = pIVar33->NameOffset;
            local_58._4_4_ = pIVar33->Offset;
            uStack_50._0_4_ = pIVar33->Width;
            uStack_50._4_4_ = pIVar33->ContentWidth;
            pIVar25 = pIVar5 + uVar37;
            IVar23 = pIVar25->ID;
            IVar18 = pIVar25->Flags;
            iVar35 = pIVar25->LastFrameVisible;
            iVar4 = pIVar25->LastFrameSelected;
            pIVar25 = pIVar5 + uVar37;
            fVar43 = pIVar25->Offset;
            uVar10 = *(undefined8 *)(&pIVar25->NameOffset + 2);
            pIVar33->NameOffset = pIVar25->NameOffset;
            pIVar33->Offset = fVar43;
            *(undefined8 *)&pIVar33->Width = uVar10;
            pIVar33->ID = IVar23;
            pIVar33->Flags = IVar18;
            pIVar33->LastFrameVisible = iVar35;
            pIVar33->LastFrameSelected = iVar4;
            pIVar33 = pIVar5 + uVar37;
            pIVar33->ID = (ImGuiID)local_68.x;
            pIVar33->Flags = (ImGuiTabItemFlags)local_68.y;
            pIVar33->LastFrameVisible = (int)local_68.z;
            pIVar33->LastFrameSelected = (int)local_68.w;
            pIVar33 = pIVar5 + uVar37;
            pIVar33->NameOffset = (undefined4)local_58;
            pIVar33->Offset = (float)local_58._4_4_;
            *(undefined8 *)(&pIVar33->NameOffset + 2) = uStack_50;
            if (pIVar5[uVar37].ID == tab_bar->SelectedTabId) {
              local_d4 = pIVar5[uVar37].ID;
            }
          }
          if ((tab_bar->Flags & 0x400000) != 0) {
            MarkIniSettingsDirty();
          }
          break;
        }
        pIVar33 = pIVar33 + 1;
        uVar31 = uVar31 - 1;
      } while (uVar31 != 0);
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar19 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar6 = GImGui->CurrentWindow;
    fVar43 = (GImGui->Style).FramePadding.y;
    fVar41 = GImGui->FontSize;
    IVar40 = (pIVar6->DC).CursorPos;
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar43;
    (pIVar6->DC).CursorPos.y = fVar42;
    (tab_bar->BarRect).Min.x = fVar41 + fVar43 + (tab_bar->BarRect).Min.x;
    local_68.x = (pIVar19->Style).Colors[0].x;
    local_68.y = (pIVar19->Style).Colors[0].y;
    uVar11 = (pIVar19->Style).Colors[0].z;
    uVar12 = (pIVar19->Style).Colors[0].w;
    local_68.w = (float)uVar12 * 0.5;
    local_68.z = (float)uVar11;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar21 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar21) {
      if (0 < (tab_bar->Tabs).Size) {
        lVar36 = 0;
        lVar27 = 0;
        pIVar34 = (ImGuiID *)0x0;
        do {
          pIVar33 = (tab_bar->Tabs).Data;
          iVar35 = *(int *)((long)&pIVar33->NameOffset + lVar36);
          if (((long)iVar35 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar35)) goto LAB_0015bc1d;
          pIVar39 = (ImGuiID *)((long)&pIVar33->ID + lVar36);
          local_88.x = 0.0;
          local_88.y = 0.0;
          bVar21 = Selectable((tab_bar->TabsNames).Buf.Data + iVar35,
                              tab_bar->SelectedTabId == *pIVar39,0,(ImVec2 *)&local_88);
          if (bVar21) {
            pIVar34 = pIVar39;
          }
          lVar27 = lVar27 + 1;
          lVar36 = lVar36 + 0x20;
        } while (lVar27 < (tab_bar->Tabs).Size);
        EndPopup();
        (pIVar6->DC).CursorPos = IVar40;
        if (pIVar34 != (ImGuiID *)0x0) {
          local_d4 = *pIVar34;
          tab_bar->SelectedTabId = local_d4;
        }
        goto LAB_0015b3ac;
      }
      EndPopup();
    }
    (pIVar6->DC).CursorPos = IVar40;
  }
LAB_0015b3ac:
  uVar37 = (tab_bar->Tabs).Size;
  iVar35 = (pIVar20->ShrinkWidthBuffer).Capacity;
  uVar38 = uVar37;
  if (iVar35 < (int)uVar37) {
    if (iVar35 == 0) {
      uVar38 = 8;
    }
    else {
      uVar38 = iVar35 / 2 + iVar35;
    }
    if ((int)uVar38 <= (int)uVar37) {
      uVar38 = uVar37;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)(int)uVar38 << 3);
    pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
    if (pIVar7 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar7,(long)(pIVar20->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar20->ShrinkWidthBuffer).Data);
    }
    (pIVar20->ShrinkWidthBuffer).Data = __dest;
    (pIVar20->ShrinkWidthBuffer).Capacity = uVar38;
    uVar38 = (tab_bar->Tabs).Size;
  }
  uVar31 = (ulong)uVar38;
  (pIVar20->ShrinkWidthBuffer).Size = uVar37;
  if ((int)uVar38 < 1) {
    bVar21 = true;
    pIVar34 = (ImGuiID *)0x0;
    fVar43 = 0.0;
  }
  else {
    fVar43 = 0.0;
    lVar36 = 0;
    lVar27 = 0;
    pIVar34 = (ImGuiID *)0x0;
    bVar21 = false;
    do {
      pIVar33 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar33->LastFrameVisible + lVar36) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1a57,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      if ((pIVar34 == (ImGuiID *)0x0) ||
         ((int)pIVar34[3] < *(int *)((long)&pIVar33->LastFrameSelected + lVar36))) {
        pIVar34 = (ImGuiID *)((long)&pIVar33->ID + lVar36);
      }
      if (*(ImGuiID *)((long)&pIVar33->ID + lVar36) == tab_bar->SelectedTabId) {
        bVar21 = true;
      }
      iVar35 = *(int *)((long)&pIVar33->NameOffset + lVar36);
      if (((long)iVar35 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar35)) {
LAB_0015bc1d:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_internal.h"
                      ,0x6c8,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar40 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar35,
                               (*(uint *)((long)&pIVar33->Flags + lVar36) >> 0x14 & 1) == 0);
      fVar41 = IVar40.x;
      *(float *)((long)&pIVar33->ContentWidth + lVar36) = fVar41;
      if (lVar27 == 0) {
        fVar42 = 0.0;
      }
      else {
        fVar42 = (pIVar20->Style).ItemInnerSpacing.x;
      }
      if ((pIVar20->ShrinkWidthBuffer).Size <= lVar27) goto LAB_0015bc3c;
      fVar43 = fVar43 + fVar42 + fVar41;
      pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
      pIVar7[lVar27].Index = (int)lVar27;
      pIVar7[lVar27].Width = fVar41;
      lVar27 = lVar27 + 1;
      uVar31 = (ulong)(tab_bar->Tabs).Size;
      lVar36 = lVar36 + 0x20;
    } while (lVar27 < (long)uVar31);
    bVar21 = !bVar21;
  }
  iVar35 = (int)uVar31;
  fVar41 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  fVar43 = (float)(-(uint)(fVar41 < fVar43) & (uint)(fVar43 - fVar41));
  if ((fVar43 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (iVar35 < 1) goto LAB_0015b691;
    fVar43 = GImGui->FontSize * 20.0;
    pIVar33 = (tab_bar->Tabs).Data;
    lVar27 = 0;
    do {
      fVar41 = *(float *)((long)&pIVar33->ContentWidth + lVar27);
      if (fVar43 <= fVar41) {
        fVar41 = fVar43;
      }
      *(float *)((long)&pIVar33->Width + lVar27) = fVar41;
      if (fVar41 <= 0.0) {
        __assert_fail("tab->Width > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1a7e,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      lVar27 = lVar27 + 0x20;
    } while ((uVar31 & 0xffffffff) << 5 != lVar27);
LAB_0015b63d:
    iVar35 = (int)uVar31;
    tab_bar->OffsetNextTab = 0.0;
    fVar43 = (pIVar20->Style).ItemInnerSpacing.x;
    uVar31 = uVar31 & 0xffffffff;
    pfVar29 = &((tab_bar->Tabs).Data)->Width;
    fVar41 = 0.0;
    fVar42 = 0.0;
    do {
      pfVar29[-1] = fVar41;
      if ((local_d4 == 0) &&
         (local_d4 = ((ImGuiTabItem *)(pfVar29 + -6))->ID, pIVar20->NavJustMovedToId != local_d4)) {
        local_d4 = 0;
      }
      fVar41 = fVar41 + (float)*(undefined8 *)pfVar29 + fVar43;
      fVar42 = fVar42 + (float)((ulong)*(undefined8 *)pfVar29 >> 0x20) + fVar43;
      pfVar29 = pfVar29 + 8;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  else {
    ShrinkWidths((pIVar20->ShrinkWidthBuffer).Data,(pIVar20->ShrinkWidthBuffer).Size,fVar43);
    iVar35 = (tab_bar->Tabs).Size;
    uVar31 = (ulong)iVar35;
    if (0 < (long)uVar31) {
      uVar37 = (pIVar20->ShrinkWidthBuffer).Size;
      uVar32 = 0;
      uVar28 = (ulong)uVar37;
      if ((int)uVar37 < 1) {
        uVar28 = uVar32;
      }
      do {
        if (uVar28 == uVar32) goto LAB_0015bc3c;
        pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
        iVar4 = pIVar7[uVar32].Index;
        if (iVar35 <= iVar4) goto LAB_0015bc91;
        (tab_bar->Tabs).Data[iVar4].Width = (float)(int)pIVar7[uVar32].Width;
        uVar32 = uVar32 + 1;
      } while (uVar31 != uVar32);
      goto LAB_0015b63d;
    }
LAB_0015b691:
    tab_bar->OffsetNextTab = 0.0;
    fVar43 = (pIVar20->Style).ItemInnerSpacing.x;
    fVar41 = 0.0;
    fVar42 = 0.0;
  }
  fVar41 = (float)(-(uint)(0.0 <= fVar41 - fVar43) & (uint)(fVar41 - fVar43));
  tab_bar->OffsetMax = fVar41;
  pIVar19 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar42 - fVar43) & (uint)(fVar42 - fVar43));
  fVar43 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar35) && (fVar42 = (tab_bar->BarRect).Min.x, fVar43 - fVar42 < fVar41)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar6 = GImGui->CurrentWindow;
    fVar48 = GImGui->FontSize + -2.0;
    fVar41 = (GImGui->Style).FramePadding.y;
    size.y = fVar41 + fVar41 + GImGui->FontSize;
    size.x = fVar48;
    local_48 = ZEXT416((uint)fVar48);
    fVar48 = fVar48 + fVar48;
    IVar40 = (pIVar6->DC).CursorPos;
    fVar41 = (tab_bar->BarRect).Max.y;
    fVar46 = IVar40.x;
    fVar47 = IVar40.y;
    bVar9 = fVar47 < (tab_bar->BarRect).Min.y;
    bVar8 = fVar43 < fVar48 + fVar46;
    if ((fVar41 < fVar47 || (fVar46 < fVar42 || bVar9)) || bVar8) {
      local_68.y = fVar41 + 0.0;
      local_68.x = (GImGui->Style).ItemInnerSpacing.x + fVar43;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_68,true);
    }
    local_68.x = (pIVar19->Style).Colors[0].x;
    local_68.y = (pIVar19->Style).Colors[0].y;
    uVar13 = (pIVar19->Style).Colors[0].z;
    uVar14 = (pIVar19->Style).Colors[0].w;
    local_68.w = (float)uVar14 * 0.5;
    local_68.z = (float)uVar13;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_70._0_4_ = (pIVar19->IO).KeyRepeatDelay;
    local_70._4_4_ = (pIVar19->IO).KeyRepeatRate;
    (pIVar19->IO).KeyRepeatDelay = 0.25;
    (pIVar19->IO).KeyRepeatRate = 0.2;
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar48;
    (pIVar6->DC).CursorPos.y = fVar43;
    bVar22 = ArrowButtonEx("##<",0,size,3);
    iVar35 = -(uint)bVar22;
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (float)local_48._0_4_ + ((tab_bar->BarRect).Max.x - fVar48);
    (pIVar6->DC).CursorPos.y = fVar43;
    bVar22 = ArrowButtonEx("##>",1,size,3);
    if (bVar22) {
      iVar35 = 1;
    }
    PopStyleColor(2);
    (pIVar19->IO).KeyRepeatDelay = (float)(undefined4)local_70;
    (pIVar19->IO).KeyRepeatRate = (float)local_70._4_4_;
    if ((fVar41 < fVar47 || (fVar46 < fVar42 || bVar9)) || bVar8) {
      PopClipRect();
    }
    if (((iVar35 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar27 = (long)(tab_bar->Tabs).Size, 0 < lVar27)) {
      pIVar33 = (tab_bar->Tabs).Data;
      do {
        if (pIVar33->ID == tab_bar->SelectedTabId) {
          iVar24 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
          iVar35 = iVar35 + iVar24;
          iVar4 = (tab_bar->Tabs).Size;
          iVar26 = iVar24;
          if (iVar35 < iVar4) {
            iVar26 = iVar35;
          }
          if (iVar35 < 0) {
            iVar26 = iVar24;
          }
          if (iVar4 <= iVar26) goto LAB_0015bc91;
          pIVar33 = (tab_bar->Tabs).Data;
          (pIVar6->DC).CursorPos = IVar40;
          fVar43 = (tab_bar->BarRect).Max.x - (fVar48 + 1.0);
          (tab_bar->BarRect).Max.x = fVar43;
          if (pIVar33 != (ImGuiTabItem *)0x0) {
            local_d4 = pIVar33[iVar26].ID;
            tab_bar->SelectedTabId = local_d4;
          }
          goto LAB_0015b93a;
        }
        pIVar33 = pIVar33 + 1;
        lVar27 = lVar27 + -1;
      } while (lVar27 != 0);
    }
    (pIVar6->DC).CursorPos = IVar40;
    fVar43 = (tab_bar->BarRect).Max.x - (fVar48 + 1.0);
    (tab_bar->BarRect).Max.x = fVar43;
  }
LAB_0015b93a:
  if (bVar21) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    IVar23 = tab_bar->SelectedTabId;
    if (IVar23 != 0) goto LAB_0015b963;
  }
  IVar23 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar23 = 0, pIVar34 != (ImGuiID *)0x0)) {
    local_d4 = *pIVar34;
    tab_bar->SelectedTabId = local_d4;
    IVar23 = local_d4;
  }
LAB_0015b963:
  tab_bar->VisibleTabId = IVar23;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_d4 != 0) && (lVar27 = (long)(tab_bar->Tabs).Size, 0 < lVar27)) {
    pIVar33 = (tab_bar->Tabs).Data;
    do {
      if (pIVar33->ID == local_d4) {
        fVar41 = GImGui->FontSize;
        iVar35 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
        fVar42 = fVar41;
        if (iVar35 < 1) {
          fVar42 = -0.0;
        }
        fVar42 = pIVar33->Offset - fVar42;
        if ((tab_bar->Tabs).Size <= iVar35 + 1) {
          fVar41 = 1.0;
        }
        fVar41 = pIVar33->Offset + pIVar33->Width + fVar41;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        fVar43 = (tab_bar->BarRect).Max.x;
        if ((fVar42 < tab_bar->ScrollingTarget) ||
           (fVar46 = fVar43 - (tab_bar->BarRect).Min.x, fVar46 <= fVar41 - fVar42)) {
          fVar47 = tab_bar->ScrollingAnim - fVar41;
        }
        else {
          if (fVar41 - fVar46 <= tab_bar->ScrollingTarget) break;
          fVar47 = (fVar42 - fVar46) - tab_bar->ScrollingAnim;
          fVar42 = fVar41 - fVar46;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
        tab_bar->ScrollingTarget = fVar42;
        break;
      }
      pIVar33 = pIVar33 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  fVar43 = tab_bar->OffsetMax - (fVar43 - (tab_bar->BarRect).Min.x);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar44._4_4_ = uVar3;
  auVar44._0_4_ = uVar2;
  auVar44._8_8_ = 0;
  auVar45._4_4_ = fVar43;
  auVar45._0_4_ = fVar43;
  auVar45._8_4_ = fVar43;
  auVar45._12_4_ = fVar43;
  auVar45 = minps(auVar44,auVar45);
  fVar43 = (float)(-(uint)(0.0 <= auVar45._0_4_) & (uint)auVar45._0_4_);
  fVar41 = (float)(-(uint)(0.0 <= auVar45._4_4_) & (uint)auVar45._4_4_);
  tab_bar->ScrollingAnim = fVar43;
  tab_bar->ScrollingTarget = fVar41;
  if ((fVar43 != fVar41) || (NAN(fVar43) || NAN(fVar41))) {
    fVar42 = pIVar20->FontSize;
    fVar46 = fVar42 * 70.0;
    uVar37 = -(uint)(fVar46 <= tab_bar->ScrollingSpeed);
    fVar47 = ABS(fVar41 - fVar43) / 0.3;
    fVar46 = (float)(~uVar37 & (uint)fVar46 | (uint)tab_bar->ScrollingSpeed & uVar37);
    uVar37 = -(uint)(fVar47 <= fVar46);
    fVar47 = (float)(~uVar37 & (uint)fVar47 | uVar37 & (uint)fVar46);
    tab_bar->ScrollingSpeed = fVar47;
    fVar46 = fVar41;
    if ((pIVar20->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar42 * 10.0)) {
      fVar47 = fVar47 * (pIVar20->IO).DeltaTime;
      if (fVar41 <= fVar43) {
        fVar46 = fVar43;
        if (fVar41 < fVar43) {
          fVar43 = fVar43 - fVar47;
          uVar37 = -(uint)(fVar41 <= fVar43);
          fVar46 = (float)((uint)fVar43 & uVar37 | ~uVar37 & (uint)fVar41);
        }
      }
      else {
        fVar46 = fVar43 + fVar47;
        if (fVar41 <= fVar46) {
          fVar46 = fVar41;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      pcVar30 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar30 != (char *)0x0) {
        memcpy(__dest_00,pcVar30,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
LAB_0015bc3c:
  pcVar30 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_0015bca6;
LAB_0015bc91:
  pcVar30 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_0015bca6:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x52e,pcVar30);
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}